

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O3

int VectorMismatch_SSE2(uint32_t *array1,uint32_t *array2,int length)

{
  ulong uVar1;
  int in_ECX;
  int iVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = 0;
  puVar3 = array2;
  puVar4 = array1;
  if (length < 0xc) {
    if (((3 < length) &&
        (auVar8._0_4_ = -(uint)(*array2 == *array1), auVar8._4_4_ = -(uint)(array2[1] == array1[1]),
        auVar8._8_4_ = -(uint)(array2[2] == array1[2]),
        auVar8._12_4_ = -(uint)(array2[3] == array1[3]), iVar2 = movmskps(in_ECX,auVar8), uVar1 = 0,
        iVar2 == 0xf)) && (uVar1 = 4, 7 < (uint)length)) {
      auVar9._0_4_ = -(uint)(array2[4] == array1[4]);
      auVar9._4_4_ = -(uint)(array2[5] == array1[5]);
      auVar9._8_4_ = -(uint)(array2[6] == array1[6]);
      auVar9._12_4_ = -(uint)(array2[7] == array1[7]);
      iVar2 = movmskps(4,auVar9);
      uVar1 = (ulong)((uint)(iVar2 == 0xf) * 4 + 4);
    }
  }
  else {
    do {
      auVar6._0_4_ = -(uint)(*puVar3 == *puVar4);
      auVar6._4_4_ = -(uint)(puVar3[1] == puVar4[1]);
      auVar6._8_4_ = -(uint)(puVar3[2] == puVar4[2]);
      auVar6._12_4_ = -(uint)(puVar3[3] == puVar4[3]);
      iVar2 = movmskps(in_ECX,auVar6);
      if (iVar2 != 0xf) break;
      iVar2 = (int)uVar1;
      puVar3 = array2 + (long)iVar2 + 4;
      puVar4 = array1 + (long)iVar2 + 4;
      auVar7._0_4_ = -(uint)(*puVar4 == *puVar3);
      auVar7._4_4_ = -(uint)(puVar4[1] == puVar3[1]);
      auVar7._8_4_ = -(uint)(puVar4[2] == puVar3[2]);
      auVar7._12_4_ = -(uint)(puVar4[3] == puVar3[3]);
      bVar5 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                       (ushort)((byte)(auVar7._12_4_ >> 7) & 1) << 0xc |
                       (ushort)((byte)(auVar7._12_4_ >> 0xf) & 1) << 0xd |
                       (ushort)((byte)(auVar7._12_4_ >> 0x17) & 1) << 0xe |
                      (ushort)(byte)(auVar7._12_4_ >> 0x1f) << 0xf) == 0xffff;
      uVar1 = (ulong)(iVar2 + 4 + (uint)bVar5 * 4);
      if (!bVar5) break;
      in_ECX = iVar2 + (uint)bVar5 * 4 + 0x10;
      puVar3 = array2 + (long)iVar2 + 8;
      puVar4 = array1 + (long)iVar2 + 8;
    } while (in_ECX < length);
  }
  if ((int)uVar1 < length) {
    uVar1 = (ulong)(int)uVar1;
    do {
      if (array1[uVar1] != array2[uVar1]) goto LAB_00143859;
      uVar1 = uVar1 + 1;
    } while (length != (int)uVar1);
    uVar1 = (ulong)(uint)length;
  }
LAB_00143859:
  return (int)uVar1;
}

Assistant:

static int VectorMismatch_SSE2(const uint32_t* const array1,
                               const uint32_t* const array2, int length) {
  int match_len;

  if (length >= 12) {
    __m128i A0 = _mm_loadu_si128((const __m128i*)&array1[0]);
    __m128i A1 = _mm_loadu_si128((const __m128i*)&array2[0]);
    match_len = 0;
    do {
      // Loop unrolling and early load both provide a speedup of 10% for the
      // current function. Also, max_limit can be MAX_LENGTH=4096 at most.
      const __m128i cmpA = _mm_cmpeq_epi32(A0, A1);
      const __m128i B0 =
          _mm_loadu_si128((const __m128i*)&array1[match_len + 4]);
      const __m128i B1 =
          _mm_loadu_si128((const __m128i*)&array2[match_len + 4]);
      if (_mm_movemask_epi8(cmpA) != 0xffff) break;
      match_len += 4;

      {
        const __m128i cmpB = _mm_cmpeq_epi32(B0, B1);
        A0 = _mm_loadu_si128((const __m128i*)&array1[match_len + 4]);
        A1 = _mm_loadu_si128((const __m128i*)&array2[match_len + 4]);
        if (_mm_movemask_epi8(cmpB) != 0xffff) break;
        match_len += 4;
      }
    } while (match_len + 12 < length);
  } else {
    match_len = 0;
    // Unroll the potential first two loops.
    if (length >= 4 &&
        _mm_movemask_epi8(_mm_cmpeq_epi32(
            _mm_loadu_si128((const __m128i*)&array1[0]),
            _mm_loadu_si128((const __m128i*)&array2[0]))) == 0xffff) {
      match_len = 4;
      if (length >= 8 &&
          _mm_movemask_epi8(_mm_cmpeq_epi32(
              _mm_loadu_si128((const __m128i*)&array1[4]),
              _mm_loadu_si128((const __m128i*)&array2[4]))) == 0xffff) {
        match_len = 8;
      }
    }
  }

  while (match_len < length && array1[match_len] == array2[match_len]) {
    ++match_len;
  }
  return match_len;
}